

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 207_courseSchedule.cpp
# Opt level: O2

bool canFinish(int numCourses,
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *prereq)

{
  pointer *this;
  int iVar1;
  pointer pvVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  ostream *poVar6;
  int i;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  vector<int,_std::allocator<int>_> *adj;
  pointer __x;
  ulong uVar10;
  _Vector_base<int,_std::allocator<int>_> _Stack_a0;
  undefined1 local_88 [8];
  vector<int,_std::allocator<int>_> vis;
  vector<int,_std::allocator<int>_> s;
  int local_48;
  allocator_type local_35;
  uint local_34;
  
  vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0;
  _Stack_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1023a6;
  local_34 = numCourses;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_88,(long)numCourses,
             (value_type *)
             &vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,&local_35);
  lVar9 = (ulong)(uint)numCourses * 0x18;
  lVar4 = -(lVar9 + 0xfU & 0xfffffffffffffff0);
  adj = (vector<int,_std::allocator<int>_> *)(local_88 + lVar4);
  if (numCourses != 0) {
    uVar7 = lVar9 - 0x18;
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x18;
    uVar10 = *(ulong *)(local_88 + lVar4 + -8);
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x1023ee;
    memset(adj,0,(uVar7 - uVar7 % uVar10) + 0x18);
  }
  pvVar2 = (prereq->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this = &vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  for (__x = (prereq->
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar2; __x = __x + 1) {
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x10240d;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)this,__x);
    piVar8 = (int *)CONCAT44(vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             vis.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_);
    iVar1 = *piVar8;
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x102425;
    std::vector<int,_std::allocator<int>_>::push_back(adj + iVar1,piVar8 + 1);
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x10242d;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)this);
  }
  uVar10 = 0;
  uVar7 = 0;
  if (0 < (int)local_34) {
    uVar7 = (ulong)local_34;
  }
  for (; uVar10 != uVar7; uVar10 = uVar10 + 1) {
    piVar3 = *(int **)((long)&vis + uVar10 * 0x18 + lVar4);
    for (piVar8 = adj[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar8 != piVar3; piVar8 = piVar8 + 1) {
      iVar1 = *piVar8;
      *(undefined8 *)(local_88 + lVar4 + -8) = 0x10247a;
      poVar6 = std::operator<<((ostream *)&std::cout,"index : ");
      *(undefined8 *)(local_88 + lVar4 + -8) = 0x102485;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar10);
      *(undefined8 *)(local_88 + lVar4 + -8) = 0x102494;
      poVar6 = std::operator<<(poVar6,":");
      *(undefined8 *)(local_88 + lVar4 + -8) = 0x10249e;
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar1);
      *(undefined8 *)(local_88 + lVar4 + -8) = 0x1024ad;
      std::operator<<(poVar6," ");
    }
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x1024bf;
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  iVar1 = 0;
  do {
    i = iVar1;
    local_48 = (int)uVar7;
    if (local_48 == i) break;
    *(undefined8 *)(local_88 + lVar4 + -8) = 0x1024df;
    bVar5 = cycle(adj,(vector<int,_std::allocator<int>_> *)local_88,i);
    iVar1 = i + 1;
  } while (!bVar5);
  if (local_34 != 0) {
    lVar9 = (ulong)(uint)numCourses * 0x18;
    do {
      *(undefined8 *)(local_88 + lVar4 + -8) = 0x102502;
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)((long)&_Stack_a0 + lVar9 + lVar4));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != 0);
  }
  bVar5 = (int)local_34 <= i;
  _Stack_a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x10251b;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)local_88);
  return bVar5;
}

Assistant:

bool canFinish(int numCourses, vector<vector<int>>& prereq) {
    int n=numCourses;
    vector<int> vis(n,0);
    vector<int> adj[n];
    for (auto s : prereq)
    {
        adj[s[0]].push_back(s[1]);
    }
    for (int i=0;i<n;i++)
    {
    	for (auto s: adj[i])
    		cout<<"index : "<<i<<":"<<s<<" ";
    	cout<<endl;
    }
    for (int i=0;i<n;i++)
    {
        if (cycle(adj,vis,i))
            return false;
    }
    return true;
}